

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall
QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::end
          (QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *this)

{
  pair<QPersistentModelIndex,_unsigned_int> *n;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x8374c9);
  QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::operator->(in_RDI);
  n = QArrayDataPointer<std::pair<QPersistentModelIndex,_unsigned_int>_>::end
                (in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }